

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O0

EStatusCode __thiscall
PDFHummus::DocumentContext::EndFormXObjectNoRelease
          (DocumentContext *this,PDFFormXObject *inFormXObject)

{
  ObjectsContext *pOVar1;
  bool bVar2;
  PDFStream *inStream;
  ObjectIDType inObjectID;
  ResourcesDictionary *inResourcesDictionary;
  pointer ppVar3;
  reference ppIVar4;
  pointer ppVar5;
  reference ppIVar6;
  _Self local_98;
  _List_node_base *local_90;
  _Self local_88;
  _Self local_80;
  iterator itTasks_1;
  _Self local_70;
  iterator it_1;
  _Self local_58;
  _List_node_base *local_50;
  _Self local_48;
  _Self local_40;
  iterator itTasks;
  _Self local_30;
  iterator it;
  PDFFormXObject *pPStack_20;
  EStatusCode status;
  PDFFormXObject *inFormXObject_local;
  DocumentContext *this_local;
  
  pOVar1 = this->mObjectsContext;
  pPStack_20 = inFormXObject;
  inFormXObject_local = (PDFFormXObject *)this;
  inStream = PDFFormXObject::GetContentStream(inFormXObject);
  it._M_node._4_4_ = ObjectsContext::EndPDFStream(pOVar1,inStream);
  this_local._4_4_ = it._M_node._4_4_;
  if (it._M_node._4_4_ == eSuccess) {
    pOVar1 = this->mObjectsContext;
    inObjectID = PDFFormXObject::GetResourcesDictionaryObjectID(pPStack_20);
    it._M_node._4_4_ = ObjectsContext::StartNewIndirectObject(pOVar1,inObjectID);
    this_local._4_4_ = it._M_node._4_4_;
    if (it._M_node._4_4_ == eSuccess) {
      inResourcesDictionary = PDFFormXObject::GetResourcesDictionary(pPStack_20);
      WriteResourcesDictionary(this,inResourcesDictionary);
      ObjectsContext::EndIndirectObject(this->mObjectsContext);
      local_30._M_node =
           (_Base_ptr)
           std::
           map<PDFFormXObject_*,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>,_std::less<PDFFormXObject_*>,_std::allocator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>_>_>_>
           ::find(&this->mFormEndTasks,&stack0xffffffffffffffe0);
      itTasks._M_node =
           (_List_node_base *)
           std::
           map<PDFFormXObject_*,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>,_std::less<PDFFormXObject_*>,_std::allocator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>_>_>_>
           ::end(&this->mFormEndTasks);
      bVar2 = std::operator!=(&local_30,(_Self *)&itTasks);
      if (bVar2) {
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>_>_>
                 ::operator->(&local_30);
        local_40._M_node =
             (_List_node_base *)
             std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>::
             begin(&ppVar3->second);
        while( true ) {
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>_>_>
                   ::operator->(&local_30);
          local_48._M_node =
               (_List_node_base *)
               std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>::
               end(&ppVar3->second);
          bVar2 = std::operator!=(&local_40,&local_48);
          if (!bVar2 || it._M_node._4_4_ != eSuccess) break;
          ppIVar4 = std::_List_iterator<IFormEndWritingTask_*>::operator*(&local_40);
          it._M_node._4_4_ =
               (*(*ppIVar4)->_vptr_IFormEndWritingTask[2])
                         (*ppIVar4,pPStack_20,this->mObjectsContext);
          std::_List_iterator<IFormEndWritingTask_*>::operator++(&local_40);
        }
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>_>_>
                 ::operator->(&local_30);
        local_50 = (_List_node_base *)
                   std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>
                   ::begin(&ppVar3->second);
        local_40._M_node = local_50;
        while( true ) {
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>_>_>
                   ::operator->(&local_30);
          local_58._M_node =
               (_List_node_base *)
               std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>::
               end(&ppVar3->second);
          bVar2 = std::operator!=(&local_40,&local_58);
          if (!bVar2) break;
          ppIVar4 = std::_List_iterator<IFormEndWritingTask_*>::operator*(&local_40);
          if (*ppIVar4 != (IFormEndWritingTask *)0x0) {
            (*(*ppIVar4)->_vptr_IFormEndWritingTask[1])();
          }
          std::_List_iterator<IFormEndWritingTask_*>::operator++(&local_40);
        }
        it_1._M_node = (_Base_ptr)
                       std::
                       map<PDFFormXObject*,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>>
                       ::erase_abi_cxx11_((map<PDFFormXObject*,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IFormEndWritingTask*,std::allocator<IFormEndWritingTask*>>>>>
                                           *)&this->mFormEndTasks,local_30._M_node);
      }
      if (it._M_node._4_4_ == eSuccess) {
        local_70._M_node =
             (_Base_ptr)
             std::
             map<PDFFormXObject_*,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>,_std::less<PDFFormXObject_*>,_std::allocator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>_>
             ::find(&this->mMoreFormEndTasks,&stack0xffffffffffffffe0);
        itTasks_1._M_node =
             (_List_node_base *)
             std::
             map<PDFFormXObject_*,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>,_std::less<PDFFormXObject_*>,_std::allocator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>_>
             ::end(&this->mMoreFormEndTasks);
        bVar2 = std::operator!=(&local_70,(_Self *)&itTasks_1);
        if (bVar2) {
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>
                   ::operator->(&local_70);
          local_80._M_node =
               (_List_node_base *)
               std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>
               ::begin(&ppVar5->second);
          while( true ) {
            ppVar5 = std::
                     _Rb_tree_iterator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>
                     ::operator->(&local_70);
            local_88._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>::end
                           (&ppVar5->second);
            bVar2 = std::operator!=(&local_80,&local_88);
            if (!bVar2 || it._M_node._4_4_ != eSuccess) break;
            ppIVar6 = std::_List_iterator<IObjectEndWritingTask_*>::operator*(&local_80);
            it._M_node._4_4_ =
                 (*(*ppIVar6)->_vptr_IObjectEndWritingTask[2])(*ppIVar6,this->mObjectsContext);
            std::_List_iterator<IObjectEndWritingTask_*>::operator++(&local_80);
          }
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>
                   ::operator->(&local_70);
          local_90 = (_List_node_base *)
                     std::__cxx11::
                     list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>::begin
                               (&ppVar5->second);
          local_80._M_node = local_90;
          while( true ) {
            ppVar5 = std::
                     _Rb_tree_iterator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>
                     ::operator->(&local_70);
            local_98._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>::end
                           (&ppVar5->second);
            bVar2 = std::operator!=(&local_80,&local_98);
            if (!bVar2) break;
            ppIVar6 = std::_List_iterator<IObjectEndWritingTask_*>::operator*(&local_80);
            if (*ppIVar6 != (IObjectEndWritingTask *)0x0) {
              (*(*ppIVar6)->_vptr_IObjectEndWritingTask[1])();
            }
            std::_List_iterator<IObjectEndWritingTask_*>::operator++(&local_80);
          }
          std::
          map<PDFFormXObject*,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>>
          ::erase_abi_cxx11_((map<PDFFormXObject*,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>,std::less<PDFFormXObject*>,std::allocator<std::pair<PDFFormXObject*const,std::__cxx11::list<IObjectEndWritingTask*,std::allocator<IObjectEndWritingTask*>>>>>
                              *)&this->mMoreFormEndTasks,(iterator)local_70._M_node);
        }
        this_local._4_4_ = it._M_node._4_4_;
      }
      else {
        this_local._4_4_ = it._M_node._4_4_;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode DocumentContext::EndFormXObjectNoRelease(PDFFormXObject* inFormXObject)
{
	EStatusCode status = mObjectsContext->EndPDFStream(inFormXObject->GetContentStream());
	if(status != eSuccess)
		return status;

	// now write the resources dictionary, full of all the goodness that got accumulated over the stream write
	status = mObjectsContext->StartNewIndirectObject(inFormXObject->GetResourcesDictionaryObjectID());
	if(status != eSuccess)
		return status;
	WriteResourcesDictionary(inFormXObject->GetResourcesDictionary());
	mObjectsContext->EndIndirectObject();

    // now write writing tasks
	{
		PDFFormXObjectToIFormEndWritingTaskListMap::iterator it= mFormEndTasks.find(inFormXObject);

		if(it != mFormEndTasks.end())
		{
			IFormEndWritingTaskList::iterator itTasks = it->second.begin();

			for(; itTasks != it->second.end() && eSuccess == status; ++itTasks)
				status = (*itTasks)->Write(inFormXObject,mObjectsContext,this);

			// one time, so delete
			for(itTasks = it->second.begin(); itTasks != it->second.end(); ++itTasks)
				delete (*itTasks);
			mFormEndTasks.erase(it);
		}

	}
	if(status != eSuccess)
		return status;


	// and more writing tasks
	{
		PDFFormXObjectToIObjectEndWritingTaskListMap::iterator it= mMoreFormEndTasks.find(inFormXObject);

		if(it != mMoreFormEndTasks.end())
		{
			IObjectEndWritingTaskList::iterator itTasks = it->second.begin();

			for(; itTasks != it->second.end() && eSuccess == status; ++itTasks)
				status = (*itTasks)->Write(mObjectsContext,this);

			// one time, so delete
			for(itTasks = it->second.begin(); itTasks != it->second.end(); ++itTasks)
				delete (*itTasks);
			mMoreFormEndTasks.erase(it);
		}		
	}

	return status;
}